

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::bson::basic_bson_parser<jsoncons::bytes_source,_std::allocator<char>_>::parse
          (basic_bson_parser<jsoncons::bytes_source,_std::allocator<char>_> *this,
          json_visitor *visitor,error_code *ec)

{
  uint8_t uVar1;
  bool bVar2;
  reference pvVar3;
  json_visitor *visitor_00;
  error_code *peVar4;
  size_type sVar5;
  string *s;
  undefined8 in_RSI;
  error_code *in_RDI;
  size_t n_1;
  uint8_t type_1;
  size_t n;
  uint8_t type;
  error_code *in_stack_00000178;
  uint8_t in_stack_00000187;
  json_visitor *in_stack_00000188;
  basic_bson_parser<jsoncons::bytes_source,_std::allocator<char>_> *in_stack_00000190;
  vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
  *in_stack_ffffffffffffff50;
  assertion_error *this_00;
  undefined8 in_stack_ffffffffffffff58;
  error_code *in_stack_ffffffffffffff60;
  error_code *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff80;
  byte bVar6;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 uVar7;
  bson_container_type in_stack_ffffffffffffff94;
  json_visitor *in_stack_ffffffffffffff98;
  basic_bson_parser<jsoncons::bytes_source,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  error_code *in_stack_ffffffffffffffb0;
  json_visitor *in_stack_ffffffffffffffb8;
  basic_bson_parser<jsoncons::bytes_source,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  char local_29;
  error_code *local_28;
  uint8_t local_19 [9];
  undefined8 local_10;
  
  local_10 = in_RSI;
  bVar2 = bytes_source::is_error((bytes_source *)(in_RDI + 1));
  if (bVar2) {
    std::error_code::operator=
              (in_stack_ffffffffffffff60,(bson_errc)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    *(undefined1 *)&in_RDI->_M_cat = 0;
    return;
  }
  while( true ) {
    bVar6 = 0;
    if (((ulong)in_RDI->_M_cat & 0x100) == 0) {
      bVar6 = *(byte *)&in_RDI->_M_cat;
    }
    if ((bVar6 & 1) == 0) break;
    pvVar3 = std::vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
             ::back(in_stack_ffffffffffffff50);
    visitor_00 = (json_visitor *)(ulong)pvVar3->mode;
    switch(visitor_00) {
    case (json_visitor *)0x0:
      pvVar3 = std::
               vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>::
               back(in_stack_ffffffffffffff50);
      pvVar3->mode = accept;
      begin_document((basic_bson_parser<jsoncons::bytes_source,_std::allocator<char>_> *)
                     CONCAT17(bVar6,in_stack_ffffffffffffff80),visitor_00,in_stack_ffffffffffffff70)
      ;
      break;
    case (json_visitor *)0x1:
      sVar5 = std::vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ::size((vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
                      *)&in_RDI[9]._M_cat);
      if (sVar5 != 1) {
        uVar7 = CONCAT13(1,(int3)in_stack_ffffffffffffff90);
        s = (string *)__cxa_allocate_exception(0x10);
        this_00 = (assertion_error *)&stack0xffffffffffffffa7;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff94,uVar7),(char *)in_RDI,
                   (allocator<char> *)CONCAT17(bVar6,in_stack_ffffffffffffff80));
        assertion_error::assertion_error(this_00,s);
        __cxa_throw(s,&assertion_error::typeinfo,assertion_error::~assertion_error);
      }
      std::vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>::clear
                ((vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
                  *)0x1ede47);
      *(undefined1 *)&in_RDI->_M_cat = 0;
      *(undefined1 *)((long)&in_RDI->_M_cat + 1) = 1;
      basic_json_visitor<char>::flush((basic_json_visitor<char> *)0x1ede61);
      break;
    case (json_visitor *)0x2:
      in_stack_ffffffffffffff70 =
           (error_code *)
           bytes_source::read((bytes_source *)(in_RDI + 1),(int)local_19,(void *)0x1,0xea5fe8);
      local_28 = in_stack_ffffffffffffff70;
      pvVar3 = std::
               vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>::
               back(in_stack_ffffffffffffff50);
      pvVar3->pos = (long)&in_stack_ffffffffffffff70->_M_value + pvVar3->pos;
      if (local_28 != (error_code *)0x1) {
        std::error_code::operator=
                  (in_stack_ffffffffffffff60,(bson_errc)((ulong)in_stack_ffffffffffffff58 >> 0x20));
        *(undefined1 *)&in_RDI->_M_cat = 0;
        return;
      }
      if (local_19[0] == '\0') {
        end_document(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      }
      else {
        read_e_name(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                    in_RDI);
        pvVar3 = std::
                 vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>::
                 back(in_stack_ffffffffffffff50);
        uVar1 = local_19[0];
        pvVar3->mode = value;
        pvVar3 = std::
                 vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>::
                 back(in_stack_ffffffffffffff50);
        pvVar3->type = uVar1;
      }
      break;
    case (json_visitor *)0x3:
      peVar4 = (error_code *)
               bytes_source::read((bytes_source *)(in_RDI + 1),(int)&local_29,(void *)0x1,0xea5fe8);
      in_stack_ffffffffffffff60 = peVar4;
      pvVar3 = std::
               vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>::
               back(in_stack_ffffffffffffff50);
      pvVar3->pos = (long)&in_stack_ffffffffffffff60->_M_value + pvVar3->pos;
      if (peVar4 != (error_code *)0x1) {
        std::error_code::operator=
                  (in_stack_ffffffffffffff60,(bson_errc)((ulong)in_stack_ffffffffffffff58 >> 0x20));
        *(undefined1 *)&in_RDI->_M_cat = 0;
        return;
      }
      if (local_29 == '\0') {
        end_array(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      }
      else {
        read_e_name(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                    in_RDI);
        read_value(in_stack_00000190,in_stack_00000188,in_stack_00000187,in_stack_00000178);
      }
      break;
    case (json_visitor *)0x4:
      pvVar3 = std::
               vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>::
               back(in_stack_ffffffffffffff50);
      pvVar3->mode = document;
      in_stack_ffffffffffffff58 = local_10;
      std::vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>::back
                (in_stack_ffffffffffffff50);
      read_value(in_stack_00000190,in_stack_00000188,in_stack_00000187,in_stack_00000178);
    }
  }
  return;
}

Assistant:

void parse(json_visitor& visitor, std::error_code& ec)
    {
        if (JSONCONS_UNLIKELY(source_.is_error()))
        {
            ec = bson_errc::source_error;
            more_ = false;
            return;
        }
        
        while (!done_ && more_)
        {
            switch (state_stack_.back().mode)
            {
                case parse_mode::root:
                    state_stack_.back().mode = parse_mode::accept;
                    begin_document(visitor, ec);
                    break;
                case parse_mode::document:
                {
                    uint8_t type;
                    std::size_t n = source_.read(&type, 1);
                    state_stack_.back().pos += n;
                    if (JSONCONS_UNLIKELY(n != 1))
                    {
                        ec = bson_errc::unexpected_eof;
                        more_ = false;
                        return;
                    }
                    if (type != 0x00)
                    {
                        read_e_name(visitor,jsoncons::bson::bson_container_type::document,ec);
                        state_stack_.back().mode = parse_mode::value;
                        state_stack_.back().type = type;
                    }
                    else
                    {
                        end_document(visitor,ec);
                    }
                    break;
                }
                case parse_mode::array:
                {
                    uint8_t type;
                    std::size_t n = source_.read(&type, 1);
                    state_stack_.back().pos += n;
                    if (JSONCONS_UNLIKELY(n != 1))
                    {
                        ec = bson_errc::unexpected_eof;
                        more_ = false;
                        return;
                    }
                    if (type != 0x00)
                    {
                        read_e_name(visitor,jsoncons::bson::bson_container_type::array,ec);
                        read_value(visitor, type, ec);
                    }
                    else
                    {
                        end_array(visitor,ec);
                    }
                    break;
                }
                case parse_mode::value:
                    state_stack_.back().mode = parse_mode::document;
                    read_value(visitor,state_stack_.back().type,ec);
                    break;
                case parse_mode::accept:
                {
                    JSONCONS_ASSERT(state_stack_.size() == 1);
                    state_stack_.clear();
                    more_ = false;
                    done_ = true;
                    visitor.flush();
                    break;
                }
            }
        }
    }